

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

Symbol * elf_pltgotentry(GlobalVars *gv,Section *sec,DynArg a,uint8_t entrysymtype,
                        unsigned_long offsadd,unsigned_long sizeadd,int etype,bool relaflag,
                        size_t relocsize,size_t addrsize)

{
  undefined4 uVar1;
  ObjectUnit *ou;
  Reloc *elfrelsize;
  Symbol *in_RDX;
  Section *in_RSI;
  Section *in_RDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  uint8_t rtype;
  Reloc *r;
  unsigned_long refoffs;
  Section *refsec;
  Symbol *tabsym;
  char entryname [256];
  char *fn;
  char *in_stack_fffffffffffffe70;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe7c;
  uint16_t in_stack_fffffffffffffe84;
  uint16_t in_stack_fffffffffffffe86;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe8c;
  Section *sec_00;
  undefined7 in_stack_fffffffffffffea0;
  uint8_t in_stack_fffffffffffffea7;
  lword in_stack_fffffffffffffea8;
  char *iname;
  int relafmt;
  Section *r_00;
  Section *in_stack_fffffffffffffec0;
  GlobalVars *in_stack_fffffffffffffec8;
  uint8_t in_stack_fffffffffffffee0;
  uint8_t in_stack_fffffffffffffee8;
  uint8_t in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef8;
  bool in_stack_ffffffffffffff00;
  
  if (in_stack_00000008 == 4) {
    r_00 = (Section *)in_RDX->obj_chain;
    iname = in_RDX->name;
  }
  else {
    r_00 = in_RDX->relsect;
    iname = (char *)in_RDX->value;
  }
  snprintf(&stack0xfffffffffffffec8,0x100," %s@%lx@%lx",in_RSI->name,r_00,iname);
  sec_00 = in_RSI;
  allocstring(in_stack_fffffffffffffe70);
  uVar2 = 1;
  uVar1 = (undefined4)in_R8;
  uVar3 = 0;
  ou = (ObjectUnit *)
       addsymbol(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,(char *)r_00,iname,
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffea7,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                 in_stack_ffffffffffffff00);
  if (ou == (ObjectUnit *)0x0) {
    ou = (ObjectUnit *)
         findlocsymbol((GlobalVars *)CONCAT44(in_stack_fffffffffffffe8c,uVar3),
                       (ObjectUnit *)
                       CONCAT26(in_stack_fffffffffffffe86,CONCAT24(in_stack_fffffffffffffe84,uVar1))
                       ,(char *)CONCAT44(in_stack_fffffffffffffe7c,uVar2));
    if (ou == (ObjectUnit *)0x0) {
      ierror("%s %s-symbol refering to %s+%lx disappeared","elf_pltgotentry():",in_RSI->name,
             r_00->name,iname);
    }
    if (in_stack_00000008 == 4) {
      elfrelsize = newreloc((GlobalVars *)
                            CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),sec_00,
                            (char *)in_RDI,(Section *)CONCAT44(in_stack_fffffffffffffe8c,uVar3),
                            CONCAT22(in_stack_fffffffffffffe86,in_stack_fffffffffffffe84),
                            CONCAT44(in_stack_fffffffffffffe7c,uVar2),(uint8_t)iname,(lword)r_00);
      relafmt = (int)((ulong)iname >> 0x20);
    }
    else {
      elfrelsize = newreloc((GlobalVars *)
                            CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),sec_00,
                            (char *)in_RDI,(Section *)CONCAT44(in_stack_fffffffffffffe8c,uVar3),
                            CONCAT22(in_stack_fffffffffffffe86,in_stack_fffffffffffffe84),
                            CONCAT44(in_stack_fffffffffffffe7c,uVar2),(uint8_t)iname,(lword)r_00);
      relafmt = (int)((ulong)iname >> 0x20);
      (elfrelsize->relocsect).symbol = in_RDX;
    }
    addreloc(in_RDI,(Reloc *)CONCAT44(in_stack_fffffffffffffe8c,uVar3),in_stack_fffffffffffffe86,
             in_stack_fffffffffffffe84,CONCAT44(in_stack_fffffffffffffe7c,uVar2));
    elf_dynreloc(ou,(Reloc *)r_00,relafmt,(size_t)elfrelsize);
    in_RSI->offset = in_R8 + in_RSI->offset;
    in_RSI->size = in_R9 + in_RSI->size;
  }
  return (Symbol *)ou;
}

Assistant:

struct Symbol *elf_pltgotentry(struct GlobalVars *gv,struct Section *sec,
                               DynArg a,uint8_t entrysymtype,
                               unsigned long offsadd,unsigned long sizeadd,
                               int etype,bool relaflag,
                               size_t relocsize,size_t addrsize)
/* Make a table entry for indirectly accessing a location from an external
   symbol defintion (GOT_ENTRY/PLT_ENTRY) or a local relocation (GOT_LOCAL).
   The entry has a size of offsadd bytes, while the table section sec will
   become sizeadd bytes larger per entry. */
{
  const char *fn = "elf_pltgotentry():";
  char entryname[MAXLEN];
  struct Symbol *tabsym;
  struct Section *refsec;
  unsigned long refoffs;

  /* determine reference section and offset of ext. symbol or local reloc */
  if (etype == GOT_LOCAL) {
    refsec = a.rel->relocsect.ptr;
    refoffs = a.rel->offset;
  }
  else {
    refsec = a.sym->relsect;
    refoffs = (unsigned long)a.sym->value;
  }

  /* generate internal symbol name for this reference */
  snprintf(entryname,MAXLEN," %s@%lx@%lx",
           sec->name,(unsigned long)refsec,refoffs);

  /* create internal symbol, or return old one, when already present */
  tabsym = addsymbol(gv,sec,allocstring(entryname),NULL,(lword)sec->offset,
                     SYM_RELOC,0,entrysymtype,SYMB_LOCAL,offsadd,FALSE);

  /* tabsym is NULL when it was just created, otherwise we already got it */
  if (tabsym == NULL) {
    static uint8_t dyn_reloc_types[] = { R_NONE,R_GLOBDAT,R_JMPSLOT,R_COPY };
    struct Reloc *r;
    uint8_t rtype;

    tabsym = findlocsymbol(gv,sec->obj,entryname);
    if (tabsym == NULL) {
      ierror("%s %s-symbol refering to %s+%lx disappeared",
             fn,sec->name,refsec->name,refoffs);
    }

    /* create a relocation for the new entry */
    if (etype == GOT_LOCAL) {
      /* local symbol: GOT relocation can be resolved now */
      r = newreloc(gv,sec,NULL,refsec,0,sec->offset,R_ABS,(lword)refoffs);
    }
    else {
      /* we need a dynamic linker relocation at the entry's offset */
      r = newreloc(gv,sec,a.sym->name,NULL,0,sec->offset,
                   dyn_reloc_types[etype],0);
      r->relocsect.symbol = a.sym;  /* resolve with external symbol */
      /* Possible enhancement: Find out whether referenced symbol resides
         in an uninitialized section, without a relocation, then we don't
         need an R_COPY relocation either! */
    }
    addreloc(sec,r,0,addrsize,-1);  /* size,mask only important for R_ABS */
    elf_dynreloc(gv->dynobj,r,relaflag,relocsize);

    /* increase offset and size counters of table-section */
    sec->offset += offsadd;
    sec->size += sizeadd;
  }

  return tabsym;
}